

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  __m256i alVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i c;
  undefined1 auVar8 [32];
  ulong uVar9;
  short sVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m256i *b;
  __m256i *ptr;
  __m256i *b_00;
  __m256i *ptr_00;
  __m256i *palVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  char *__format;
  undefined4 uVar23;
  undefined4 uVar24;
  ulong uVar25;
  short sVar26;
  uint uVar27;
  size_t __n;
  bool bVar28;
  undefined2 uVar29;
  undefined2 uVar30;
  undefined2 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined8 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb4;
  int iVar44;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  __m256i *ptr_01;
  long local_1f8;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar1 = (profile->profile16).score;
    if (pvVar1 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile16.score";
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar25 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "open";
        }
        else {
          if (-1 < gap) {
            iVar44 = ppVar2->min;
            iVar16 = -iVar44;
            if (iVar44 != -open && SBORROW4(iVar44,-open) == iVar44 + open < 0) {
              iVar16 = open;
            }
            sVar10 = 0x7ffe - (short)ppVar2->max;
            ppVar12 = parasail_result_new_table1((uint)(uVar25 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar12 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar21 = uVar25 + 0xf >> 4;
            ppVar12->flag = ppVar12->flag | 0x10220404;
            b = parasail_memalign___m256i(0x20,uVar21);
            ptr = parasail_memalign___m256i(0x20,uVar21);
            b_00 = parasail_memalign___m256i(0x20,uVar21);
            ptr_00 = parasail_memalign___m256i(0x20,uVar21);
            palVar13 = parasail_memalign___m256i(0x20,uVar21);
            if (palVar13 == (__m256i *)0x0 ||
                ((ptr_00 == (__m256i *)0x0 || b_00 == (__m256i *)0x0) ||
                (ptr == (__m256i *)0x0 || b == (__m256i *)0x0))) {
              return (parasail_result_t *)0x0;
            }
            uVar29 = (undefined2)open;
            uVar30 = (undefined2)gap;
            uVar27 = iVar16 - 0x7fff;
            uVar31 = (undefined2)uVar27;
            uVar14 = uVar27 & 0xffff;
            uVar20 = (uint)uVar21;
            auVar32._0_2_ = (undefined2)-(gap * uVar20);
            auVar32._2_2_ = auVar32._0_2_;
            auVar32._4_2_ = auVar32._0_2_;
            auVar32._6_2_ = auVar32._0_2_;
            auVar32._8_2_ = auVar32._0_2_;
            auVar32._10_2_ = auVar32._0_2_;
            auVar32._12_2_ = auVar32._0_2_;
            auVar32._14_2_ = auVar32._0_2_;
            auVar32._16_2_ = auVar32._0_2_;
            auVar32._18_2_ = auVar32._0_2_;
            auVar32._20_2_ = auVar32._0_2_;
            auVar32._22_2_ = auVar32._0_2_;
            auVar32._24_2_ = auVar32._0_2_;
            auVar32._26_2_ = auVar32._0_2_;
            auVar32._28_2_ = auVar32._0_2_;
            auVar32._30_2_ = auVar32._0_2_;
            auVar32 = vpand_avx2(auVar32,_DAT_008a5920);
            auVar32 = vpaddsw_avx2(ZEXT432(uVar14),auVar32);
            alVar5[1]._0_4_ = iVar16;
            alVar5[0] = in_stack_fffffffffffffda8;
            alVar5[1]._4_4_ = in_stack_fffffffffffffdb4;
            alVar5[2]._0_4_ = in_stack_fffffffffffffdb8;
            alVar5[2]._4_4_ = in_stack_fffffffffffffdbc;
            alVar5[3] = (longlong)palVar13;
            parasail_memset___m256i(b_00,alVar5,uVar21);
            c[1]._0_4_ = iVar16;
            c[0] = in_stack_fffffffffffffda8;
            c[1]._4_4_ = in_stack_fffffffffffffdb4;
            c[2]._0_4_ = in_stack_fffffffffffffdb8;
            c[2]._4_4_ = in_stack_fffffffffffffdbc;
            c[3] = (longlong)palVar13;
            parasail_memset___m256i(b,c,uVar21);
            auVar7._2_2_ = uVar30;
            auVar7._0_2_ = uVar30;
            auVar7._4_2_ = uVar30;
            auVar7._6_2_ = uVar30;
            auVar7._8_2_ = uVar30;
            auVar7._10_2_ = uVar30;
            auVar7._12_2_ = uVar30;
            auVar7._14_2_ = uVar30;
            auVar7._16_2_ = uVar30;
            auVar7._18_2_ = uVar30;
            auVar7._20_2_ = uVar30;
            auVar7._22_2_ = uVar30;
            auVar7._24_2_ = uVar30;
            auVar7._26_2_ = uVar30;
            auVar7._28_2_ = uVar30;
            auVar7._30_2_ = uVar30;
            auVar38 = ZEXT3264(auVar7);
            auVar34._2_2_ = uVar29;
            auVar34._0_2_ = uVar29;
            auVar34._4_2_ = uVar29;
            auVar34._6_2_ = uVar29;
            auVar34._8_2_ = uVar29;
            auVar34._10_2_ = uVar29;
            auVar34._12_2_ = uVar29;
            auVar34._14_2_ = uVar29;
            auVar34._16_2_ = uVar29;
            auVar34._18_2_ = uVar29;
            auVar34._20_2_ = uVar29;
            auVar34._22_2_ = uVar29;
            auVar34._24_2_ = uVar29;
            auVar34._26_2_ = uVar29;
            auVar34._28_2_ = uVar29;
            auVar34._30_2_ = uVar29;
            auVar37 = ZEXT3264(auVar34);
            alVar5 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
            uVar11 = uVar20 - 1;
            for (uVar15 = uVar11; -1 < (int)uVar15; uVar15 = uVar15 - 1) {
              palVar13[uVar15] = alVar5;
              alVar5 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar5,auVar7);
            }
            uVar9 = (ulong)(uint)s2Len;
            __n = uVar21 << 5;
            lVar22 = uVar21 * uVar9;
            auVar39 = ZEXT3264(CONCAT230(sVar10,CONCAT228(sVar10,CONCAT226(sVar10,CONCAT224(sVar10,
                                                  CONCAT222(sVar10,CONCAT220(sVar10,CONCAT218(sVar10
                                                  ,CONCAT216(sVar10,CONCAT214(sVar10,CONCAT212(
                                                  sVar10,CONCAT210(sVar10,CONCAT28(sVar10,CONCAT26(
                                                  sVar10,CONCAT24(sVar10,CONCAT22(sVar10,sVar10)))))
                                                  )))))))))));
            auVar41._2_2_ = uVar31;
            auVar41._0_2_ = uVar31;
            auVar41._4_2_ = uVar31;
            auVar41._6_2_ = uVar31;
            auVar41._8_2_ = uVar31;
            auVar41._10_2_ = uVar31;
            auVar41._12_2_ = uVar31;
            auVar41._14_2_ = uVar31;
            auVar41._16_2_ = uVar31;
            auVar41._18_2_ = uVar31;
            auVar41._20_2_ = uVar31;
            auVar41._22_2_ = uVar31;
            auVar41._24_2_ = uVar31;
            auVar41._26_2_ = uVar31;
            auVar41._28_2_ = uVar31;
            auVar41._30_2_ = uVar31;
            auVar40 = ZEXT3264(auVar41);
            auVar42 = ZEXT3264(auVar41);
            auVar43 = ZEXT3264(auVar41);
            local_1f8 = 0;
            iVar44 = 0;
            ptr_01 = palVar13;
            for (uVar21 = 0; uVar21 != uVar9; uVar21 = uVar21 + 1) {
              alVar5 = b_00[uVar11];
              auVar7 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,0x28);
              auVar7 = vpalignr_avx2((undefined1  [32])alVar5,auVar7,0xe);
              iVar16 = ppVar2->mapper[(byte)s2[uVar21]];
              auVar36 = ZEXT1664((undefined1  [16])0x0);
              sVar19 = 0;
              auVar4._2_2_ = uVar31;
              auVar4._0_2_ = uVar31;
              auVar4._4_2_ = uVar31;
              auVar4._6_2_ = uVar31;
              auVar4._8_2_ = uVar31;
              auVar4._10_2_ = uVar31;
              auVar4._12_2_ = uVar31;
              auVar4._14_2_ = uVar31;
              auVar4._16_2_ = uVar31;
              auVar4._18_2_ = uVar31;
              auVar4._20_2_ = uVar31;
              auVar4._22_2_ = uVar31;
              auVar4._24_2_ = uVar31;
              auVar4._26_2_ = uVar31;
              auVar4._28_2_ = uVar31;
              auVar4._30_2_ = uVar31;
              while( true ) {
                auVar34 = auVar36._0_32_;
                if (__n == sVar19) break;
                auVar41 = vpaddsw_avx2(auVar7,*(undefined1 (*) [32])
                                               ((long)pvVar1 +
                                               sVar19 + (long)(int)(iVar16 * uVar20) * 0x20));
                auVar7 = *(undefined1 (*) [32])((long)*b_00 + sVar19);
                auVar35 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + sVar19),auVar38._0_32_);
                auVar6 = vpsubsw_avx2(auVar7,auVar37._0_32_);
                auVar34 = vpaddsw_avx2(auVar34,*(undefined1 (*) [32])((long)*palVar13 + sVar19));
                auVar35 = vpmaxsw_avx2(auVar35,auVar6);
                auVar4 = vpmaxsw_avx2(auVar4,auVar34);
                *(undefined1 (*) [32])((long)*b + sVar19) = auVar35;
                auVar34 = vpmaxsw_avx2(auVar35,auVar41);
                auVar36 = ZEXT3264(auVar34);
                *(undefined1 (*) [32])((long)*ptr + sVar19) = auVar34;
                sVar19 = sVar19 + 0x20;
              }
              auVar7 = vperm2i128_avx2(auVar34,auVar34,0x28);
              auVar34 = vpalignr_avx2(auVar34,auVar7,0xe);
              auVar7 = vpaddsw_avx2(auVar34,(undefined1  [32])*palVar13);
              auVar7 = vpmaxsw_avx2(auVar4,auVar7);
              iVar16 = 0xe;
              while( true ) {
                auVar41 = vperm2i128_avx2(auVar7,auVar7,8);
                auVar41 = vpalignr_avx2(auVar7,auVar41,0xe);
                bVar28 = iVar16 == 0;
                iVar16 = iVar16 + -1;
                if (bVar28) break;
                auVar41 = vpaddsw_avx2(auVar32,auVar41);
                auVar7 = vpmaxsw_avx2(auVar7,auVar41);
              }
              auVar7 = vpaddsw_avx2(auVar41,ZEXT432(uVar14));
              auVar34 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
              auVar34 = vpmaxsw_avx2(auVar34,auVar7);
              sVar19 = 0;
              lVar17 = local_1f8;
              while( true ) {
                auVar41 = auVar42._0_32_;
                if (__n == sVar19) break;
                auVar7 = vpsubsw_avx2(auVar7,auVar38._0_32_);
                auVar34 = vpsubsw_avx2(auVar34,auVar37._0_32_);
                auVar7 = vpmaxsw_avx2(auVar7,auVar34);
                auVar34 = vpmaxsw_avx2(auVar7,*(undefined1 (*) [32])((long)*ptr + sVar19));
                auVar34 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar34);
                *(undefined1 (*) [32])((long)*b_00 + sVar19) = auVar34;
                piVar3 = ((ppVar12->field_4).rowcols)->score_row;
                auVar33 = auVar34._0_16_;
                uVar23 = vpextrw_avx(auVar33,0);
                *(undefined4 *)((long)piVar3 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,1);
                *(undefined4 *)((long)piVar3 + lVar22 * 4 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,2);
                uVar24 = vpextrw_avx(auVar33,3);
                *(undefined4 *)((long)piVar3 + lVar22 * 8 + lVar17) = uVar23;
                *(undefined4 *)((long)piVar3 + lVar22 * 0xc + lVar17) = uVar24;
                uVar23 = vpextrw_avx(auVar33,4);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x10 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,5);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x14 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,6);
                uVar24 = vpextrw_avx(auVar33,7);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x18 + lVar17) = uVar23;
                auVar33 = auVar34._16_16_;
                uVar23 = vpextrw_avx(auVar33,0);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x1c + lVar17) = uVar24;
                *(undefined4 *)((long)piVar3 + lVar22 * 0x20 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,1);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x24 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,2);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x28 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,3);
                uVar24 = vpextrw_avx(auVar33,4);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x2c + lVar17) = uVar23;
                *(undefined4 *)((long)piVar3 + lVar22 * 0x30 + lVar17) = uVar24;
                uVar23 = vpextrw_avx(auVar33,5);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x34 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,6);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x38 + lVar17) = uVar23;
                uVar23 = vpextrw_avx(auVar33,7);
                *(undefined4 *)((long)piVar3 + lVar22 * 0x3c + lVar17) = uVar23;
                auVar4 = vpminsw_avx2(auVar39._0_32_,auVar34);
                auVar39 = ZEXT3264(auVar4);
                auVar4 = vpmaxsw_avx2(auVar40._0_32_,auVar34);
                auVar40 = ZEXT3264(auVar4);
                auVar41 = vpmaxsw_avx2(auVar41,auVar34);
                auVar42 = ZEXT3264(auVar41);
                sVar19 = sVar19 + 0x20;
                lVar17 = lVar17 + uVar9 * 4;
              }
              auVar7 = vpcmpgtw_avx2(auVar41,auVar43._0_32_);
              if ((((((((((((((((((((((((((((((((auVar7 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar7 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar7 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar7 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar7 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar7 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar7 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar7 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar7 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar7 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar7 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar7 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar7 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar7 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar7 >> 0x77 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar7 >> 0x7f,0) != '\0')
                                || (auVar7 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar7 >> 0x8f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar7 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar7 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar7 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar7 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar7 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar7 >> 0xbf,0) != '\0') ||
                        (auVar7 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar7 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar7 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar7 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar7 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar7 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar7 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar7[0x1f] < '\0') {
                auVar7 = vpermq_avx2(auVar41,0x44);
                auVar7 = vpmaxsw_avx2(auVar41,auVar7);
                auVar34 = vpslldq_avx2(auVar7,8);
                auVar7 = vpmaxsw_avx2(auVar7,auVar34);
                auVar34 = vpslldq_avx2(auVar7,4);
                auVar7 = vpmaxsw_avx2(auVar7,auVar34);
                auVar34 = vpslldq_avx2(auVar7,2);
                auVar7 = vpmaxsw_avx2(auVar7,auVar34);
                uVar27 = vpextrw_avx(auVar7._16_16_,7);
                auVar7 = vpshufhw_avx2(auVar7,0xff);
                auVar35._8_4_ = 6;
                auVar35._0_8_ = 0x600000006;
                auVar35._12_4_ = 6;
                auVar35._16_4_ = 6;
                auVar35._20_4_ = 6;
                auVar35._24_4_ = 6;
                auVar35._28_4_ = 6;
                auVar7 = vpermd_avx2(auVar35,auVar7);
                palVar13 = ptr_01;
                memcpy(ptr_00,b_00,__n);
                auVar43 = ZEXT3264(auVar7);
                auVar42 = ZEXT3264(auVar41);
                auVar40 = ZEXT3264(auVar40._0_32_);
                auVar39 = ZEXT3264(auVar39._0_32_);
                auVar38 = ZEXT3264(CONCAT230(uVar30,CONCAT228(uVar30,CONCAT226(uVar30,CONCAT224(
                                                  uVar30,CONCAT222(uVar30,CONCAT220(uVar30,CONCAT218
                                                  (uVar30,CONCAT216(uVar30,CONCAT214(uVar30,
                                                  CONCAT212(uVar30,CONCAT210(uVar30,CONCAT28(uVar30,
                                                  CONCAT26(uVar30,CONCAT24(uVar30,CONCAT22(uVar30,
                                                  uVar30))))))))))))))));
                auVar37 = ZEXT3264(CONCAT230(uVar29,CONCAT228(uVar29,CONCAT226(uVar29,CONCAT224(
                                                  uVar29,CONCAT222(uVar29,CONCAT220(uVar29,CONCAT218
                                                  (uVar29,CONCAT216(uVar29,CONCAT214(uVar29,
                                                  CONCAT212(uVar29,CONCAT210(uVar29,CONCAT28(uVar29,
                                                  CONCAT26(uVar29,CONCAT24(uVar29,CONCAT22(uVar29,
                                                  uVar29))))))))))))))));
                iVar44 = (int)uVar21;
                ptr_01 = palVar13;
              }
              local_1f8 = local_1f8 + 4;
            }
            uVar21 = 0;
            sVar26 = (short)uVar27;
            while( true ) {
              iVar16 = (int)uVar25;
              if ((uVar20 & 0x7ffffff) << 4 == (uint)uVar21) break;
              if ((*(short *)((long)*ptr_00 + uVar21 * 2) == sVar26) &&
                 (uVar15 = ((uint)uVar21 & 0xf) * uVar20 + ((uint)(uVar21 >> 4) & 0xfffffff),
                 (int)uVar15 < iVar16)) {
                uVar25 = (ulong)uVar15;
              }
              uVar21 = uVar21 + 1;
            }
            auVar6._2_2_ = uVar31;
            auVar6._0_2_ = uVar31;
            auVar6._4_2_ = uVar31;
            auVar6._6_2_ = uVar31;
            auVar6._8_2_ = uVar31;
            auVar6._10_2_ = uVar31;
            auVar6._12_2_ = uVar31;
            auVar6._14_2_ = uVar31;
            auVar6._16_2_ = uVar31;
            auVar6._18_2_ = uVar31;
            auVar6._20_2_ = uVar31;
            auVar6._22_2_ = uVar31;
            auVar6._24_2_ = uVar31;
            auVar6._26_2_ = uVar31;
            auVar6._28_2_ = uVar31;
            auVar6._30_2_ = uVar31;
            auVar32 = vpcmpgtw_avx2(auVar6,auVar39._0_32_);
            auVar8._2_2_ = sVar10;
            auVar8._0_2_ = sVar10;
            auVar8._4_2_ = sVar10;
            auVar8._6_2_ = sVar10;
            auVar8._8_2_ = sVar10;
            auVar8._10_2_ = sVar10;
            auVar8._12_2_ = sVar10;
            auVar8._14_2_ = sVar10;
            auVar8._16_2_ = sVar10;
            auVar8._18_2_ = sVar10;
            auVar8._20_2_ = sVar10;
            auVar8._22_2_ = sVar10;
            auVar8._24_2_ = sVar10;
            auVar8._26_2_ = sVar10;
            auVar8._28_2_ = sVar10;
            auVar8._30_2_ = sVar10;
            auVar7 = vpcmpgtw_avx2(auVar40._0_32_,auVar8);
            auVar32 = vpor_avx2(auVar7,auVar32);
            if ((((((((((((((((((((((((((((((((auVar32 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar32 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar32 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar32 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar32 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar32 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar32 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar32 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar32 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar32 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar32 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar32 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar32 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar32 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar32 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar32 >> 0x7f,0) != '\0') ||
                              (auVar32 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar32 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar32 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar32 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar32 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar32 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar32 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar32 >> 0xbf,0) != '\0') ||
                      (auVar32 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar32 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar32 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar32 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar32 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar32 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar32[0x1f] < '\0') {
              *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
              sVar26 = 0;
              iVar44 = 0;
              iVar16 = 0;
            }
            ppVar12->score = (int)sVar26;
            ppVar12->end_query = iVar16;
            ppVar12->end_ref = iVar44;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar12;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_scan_profile_avx2_256_16",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        vH = _mm256_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            vH = _mm256_max_epi16(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}